

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O0

Roaring * doublechecked::Roaring::fastunion(size_t n,Roaring **inputs)

{
  undefined1 auVar1 [16];
  bool bVar2;
  ulong uVar3;
  Roaring *r;
  char *file;
  long in_RDX;
  ulong in_RSI;
  Roaring *in_RDI;
  size_t i_1;
  Roaring temp;
  size_t i;
  Roaring **plain_inputs;
  Roaring *ans;
  int in_stack_ffffffffffffff0c;
  Roaring *in_stack_ffffffffffffff10;
  Roaring *this;
  Roaring *this_00;
  ulong local_c8;
  Roaring **in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffff58;
  Roaring *in_stack_ffffffffffffffb8;
  Roaring *in_stack_ffffffffffffffc0;
  ulong local_28;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_RSI;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  this_00 = in_RDI;
  r = (Roaring *)operator_new__(uVar3);
  for (local_28 = 0; local_28 < in_RSI; local_28 = local_28 + 1) {
    *(undefined8 *)(&(r->plain).roaring.high_low_container.size + local_28 * 2) =
         *(undefined8 *)(in_RDX + local_28 * 8);
  }
  this = (Roaring *)&stack0xffffffffffffffa8;
  roaring::Roaring::fastunion(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  Roaring(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  roaring::Roaring::~Roaring(&in_stack_ffffffffffffff10->plain);
  if (r != (Roaring *)0x0) {
    operator_delete__(r);
  }
  if (in_RSI == 0) {
    file = (char *)cardinality(this);
    _assert_true((unsigned_long)this,(char *)r,file,in_stack_ffffffffffffff0c);
  }
  else {
    Roaring(this_00,in_RDI);
    for (local_c8 = 1; local_c8 < in_RSI; local_c8 = local_c8 + 1) {
      operator|=(this_00,in_RDI);
    }
    bVar2 = operator==(this,r);
    _assert_true((unsigned_long)this,(char *)r,(char *)in_stack_ffffffffffffff10,
                 CONCAT13(bVar2,(int3)in_stack_ffffffffffffff0c));
    ~Roaring(in_stack_ffffffffffffff10);
  }
  return this_00;
}

Assistant:

static Roaring fastunion(size_t n, const Roaring **inputs) {
        auto plain_inputs = new const roaring::Roaring *[n];
        for (size_t i = 0; i < n; ++i) plain_inputs[i] = &inputs[i]->plain;
        Roaring ans(roaring::Roaring::fastunion(n, plain_inputs));
        delete[] plain_inputs;

        if (n == 0)
            assert_true(ans.cardinality() == 0);
        else {
            Roaring temp = *inputs[0];
            for (size_t i = 1; i < n; ++i) temp |= *inputs[i];
            assert_true(temp == ans);
        }

        return ans;
    }